

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialPropsCmd.cpp
# Opt level: O0

int cmdline_parser_required2(gengetopt_args_info *args_info,char *prog_name,char *additional_error)

{
  char *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  int error_occurred;
  char *local_58;
  char *local_38;
  int local_1c;
  
  local_1c = 0;
  if (*(int *)(in_RDI + 0x1a8) == 0) {
    local_38 = in_RDX;
    if (in_RDX == (char *)0x0) {
      local_38 = "";
    }
    fprintf(_stderr,"%s: \'--input\' (\'-i\') option required%s\n",in_RSI,local_38);
    local_1c = 1;
  }
  if (*(int *)(in_RDI + 0x20c) == 0) {
    local_58 = in_RDX;
    if (in_RDX == (char *)0x0) {
      local_58 = "";
    }
    fprintf(_stderr,"%s: %d options of group sequentialProps were given. One is required%s.\n",
            in_RSI,(ulong)*(uint *)(in_RDI + 0x20c),local_58);
    local_1c = 1;
  }
  return local_1c;
}

Assistant:

int
cmdline_parser_required2 (struct gengetopt_args_info *args_info, const char *prog_name, const char *additional_error)
{
  int error_occurred = 0;
  FIX_UNUSED (additional_error);

  /* checks for required options */
  if (! args_info->input_given)
    {
      fprintf (stderr, "%s: '--input' ('-i') option required%s\n", prog_name, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  
  if (args_info->sequentialProps_group_counter == 0)
    {
      fprintf (stderr, "%s: %d options of group sequentialProps were given. One is required%s.\n", prog_name, args_info->sequentialProps_group_counter, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  

  /* checks for dependences among options */

  return error_occurred;
}